

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

uint __thiscall
fmt::internal::PrintfFormatter<char>::parse_header
          (PrintfFormatter<char> *this,char **s,FormatSpec *spec)

{
  uint uVar1;
  Arg *in_RDX;
  ArgVisitor<fmt::(anonymous_namespace)::WidthHandler,_unsigned_int> *in_RSI;
  PrintfFormatter<char> *in_RDI;
  uint value;
  char c;
  uint arg_index;
  char **in_stack_ffffffffffffffc0;
  WidthHandler local_38;
  uint local_2c;
  char local_25;
  uint local_24;
  PrintfFormatter<char> *this_00;
  
  local_24 = 0xffffffff;
  local_25 = **(char **)in_RSI;
  this_00 = in_RDI;
  if (('/' < local_25) && (local_25 < ':')) {
    local_2c = parse_nonnegative_int<char>(in_stack_ffffffffffffffc0);
    if (**(char **)in_RSI == '$') {
      *(char **)in_RSI = *(char **)in_RSI + 1;
      local_24 = local_2c;
    }
    else {
      if (local_25 == '0') {
        *(wchar_t *)((long)&(in_RDX->super_Value).field_0 + 4) = L'0';
      }
      if (local_2c != 0) {
        (in_RDX->super_Value).field_0.uint_value = local_2c;
        return local_24;
      }
    }
  }
  parse_flags(in_RDI,(FormatSpec *)in_RDX,(char **)in_RSI);
  if ((**(char **)in_RSI < '0') || ('9' < **(char **)in_RSI)) {
    if (**(char **)in_RSI == '*') {
      *(char **)in_RSI = *(char **)in_RSI + 1;
      anon_unknown_1::WidthHandler::WidthHandler(&local_38,(FormatSpec *)in_RDX);
      std::numeric_limits<unsigned_int>::max();
      get_arg(this_00,(char *)in_RSI,(uint)((ulong)in_RDX >> 0x20));
      uVar1 = ArgVisitor<fmt::(anonymous_namespace)::WidthHandler,_unsigned_int>::visit
                        (in_RSI,in_RDX);
      (in_RDX->super_Value).field_0.uint_value = uVar1;
    }
  }
  else {
    uVar1 = parse_nonnegative_int<char>(in_stack_ffffffffffffffc0);
    (in_RDX->super_Value).field_0.uint_value = uVar1;
  }
  return local_24;
}

Assistant:

unsigned fmt::internal::PrintfFormatter<Char>::parse_header(
  const Char *&s, FormatSpec &spec) {
  unsigned arg_index = UINT_MAX;
  Char c = *s;
  if (c >= '0' && c <= '9') {
    // Parse an argument index (if followed by '$') or a width possibly
    // preceded with '0' flag(s).
    unsigned value = parse_nonnegative_int(s);
    if (*s == '$') {  // value is an argument index
      ++s;
      arg_index = value;
    } else {
      if (c == '0')
        spec.fill_ = '0';
      if (value != 0) {
        // Nonzero value means that we parsed width and don't need to
        // parse it or flags again, so return now.
        spec.width_ = value;
        return arg_index;
      }
    }
  }
  parse_flags(spec, s);
  // Parse width.
  if (*s >= '0' && *s <= '9') {
    spec.width_ = parse_nonnegative_int(s);
  } else if (*s == '*') {
    ++s;
    spec.width_ = fmt::WidthHandler(spec).visit(get_arg(s));
  }
  return arg_index;
}